

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[13],kj::String,char_const(&)[4],int_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [13],String *params_1,
          char (*params_2) [4],int *params_3,char (*params_4) [2])

{
  char *pcVar1;
  undefined1 local_78 [16];
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  strlen((char *)this);
  pcVar1 = *(char **)(*params + 8);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)*params;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  local_68.size_ = strlen((char *)params_1);
  local_68.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,(int)*params_2);
  local_78._8_8_ = strlen((char *)params_3);
  local_78._0_8_ = params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&stack0xffffffffffffff78,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)local_78,
             (ArrayPtr<const_char> *)this);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}